

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# add_offset.c
# Opt level: O0

int teardown_container_add_offset_test(void **state_)

{
  undefined8 *puVar1;
  long *in_RDI;
  container_add_offset_test_case_t test;
  container_add_offset_test_state_t *state;
  uint8_t in_stack_ffffffffffffffcf;
  container_t *c;
  
  puVar1 = (undefined8 *)*in_RDI;
  c = (container_t *)*puVar1;
  if (puVar1[4] != 0) {
    container_free(c,in_stack_ffffffffffffffcf);
    puVar1[4] = 0;
  }
  if (puVar1[5] != 0) {
    container_free(c,in_stack_ffffffffffffffcf);
    puVar1[5] = 0;
  }
  if (puVar1[6] != 0) {
    container_free(c,in_stack_ffffffffffffffcf);
    puVar1[6] = 0;
  }
  if (puVar1[7] != 0) {
    container_free(c,in_stack_ffffffffffffffcf);
    puVar1[7] = 0;
  }
  if (puVar1[8] != 0) {
    container_free(c,in_stack_ffffffffffffffcf);
    puVar1[8] = 0;
  }
  return 0;
}

Assistant:

static int teardown_container_add_offset_test(void **state_) {
    container_add_offset_test_state_t *state =
        *(container_add_offset_test_state_t **)state_;
    container_add_offset_test_case_t test = state->test_case;
    if (state->in) {
        container_free(state->in, test.type);
        state->in = NULL;
    }
    if (state->lo) {
        container_free(state->lo, test.type);
        state->lo = NULL;
    }
    if (state->hi) {
        container_free(state->hi, test.type);
        state->hi = NULL;
    }
    if (state->lo_only) {
        container_free(state->lo_only, test.type);
        state->lo_only = NULL;
    }
    if (state->hi_only) {
        container_free(state->hi_only, test.type);
        state->hi_only = NULL;
    }

    return 0;
}